

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O3

void __thiscall
duckdb::RowGroupCollection::Checkpoint
          (RowGroupCollection *this,TableDataWriter *writer,TableStatistics *global_stats)

{
  shared_ptr<duckdb::RowGroupSegmentTree,_true> *this_00;
  __int_type _Var1;
  _Head_base<0UL,_duckdb::RowGroup_*,_false> _Var2;
  bool bVar3;
  RowGroupSegmentTree *pRVar4;
  DatabaseInstance *db;
  DBConfig *pDVar5;
  reference pvVar6;
  pointer pRVar7;
  pointer pTVar8;
  type this_01;
  reference pvVar9;
  reference pvVar10;
  type writer_00;
  InternalException *this_02;
  unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *this_03;
  RowGroupCollection *pRVar11;
  ulong uVar12;
  size_type sVar13;
  SegmentLock l;
  RowGroupPointer pointer;
  VacuumState vacuum_state;
  _Head_base<0UL,_duckdb::RowGroupWriter_*,_false> local_290;
  _Head_base<0UL,_duckdb::RowGroup_*,_false> local_288;
  _Head_base<0UL,_duckdb::RowGroupWriter_*,_false> local_280;
  _Head_base<0UL,_duckdb::Task_*,_false> local_278;
  RowGroupCollection *local_270;
  vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
  local_268;
  __int_type local_248;
  TableDataWriter *local_240;
  TableStatistics *local_238;
  unique_lock<std::mutex> local_230;
  shared_ptr<duckdb::RowGroupSegmentTree,_true> *local_220;
  RowGroupWriteData local_218;
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [112];
  VacuumState local_160;
  CollectionCheckpointState local_130 [2];
  
  this_00 = &this->row_groups;
  local_270 = this;
  local_240 = writer;
  local_238 = global_stats;
  pRVar4 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(this_00);
  local_230._M_device = &(pRVar4->super_SegmentTree<duckdb::RowGroup,_true>).node_lock;
  local_230._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_230);
  local_230._M_owns = true;
  local_220 = this_00;
  pRVar4 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(this_00);
  do {
    bVar3 = SegmentTree<duckdb::RowGroup,_true>::LoadNextSegment
                      (&pRVar4->super_SegmentTree<duckdb::RowGroup,_true>,(SegmentLock *)&local_230)
    ;
    pRVar11 = local_270;
  } while (bVar3);
  local_268.
  super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pRVar4->super_SegmentTree<duckdb::RowGroup,_true>).nodes.
       super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
       .
       super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_268.
  super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pRVar4->super_SegmentTree<duckdb::RowGroup,_true>).nodes.
       super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
       .
       super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_268.
  super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pRVar4->super_SegmentTree<duckdb::RowGroup,_true>).nodes.
       super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
       .
       super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pRVar4->super_SegmentTree<duckdb::RowGroup,_true>).nodes.
  super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
  .
  super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pRVar4->super_SegmentTree<duckdb::RowGroup,_true>).nodes.
  super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
  .
  super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pRVar4->super_SegmentTree<duckdb::RowGroup,_true>).nodes.
  super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
  .
  super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CollectionCheckpointState::CollectionCheckpointState
            (local_130,local_270,local_240,
             (vector<duckdb::SegmentNode<duckdb::RowGroup>,_true> *)&local_268,local_238);
  local_160.can_vacuum_deletes = false;
  local_160.row_start = 0;
  local_160.next_vacuum_idx = 0;
  local_160.row_group_counts.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_160.row_group_counts.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_160.row_group_counts.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  InitializeVacuumState
            (pRVar11,local_130,&local_160,
             (vector<duckdb::SegmentNode<duckdb::RowGroup>,_true> *)&local_268);
  db = TableDataWriter::GetDatabase(local_240);
  pDVar5 = DBConfig::GetConfig(db);
  if (local_268.
      super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_268.
      super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar12 = 0;
    sVar13 = 0;
    do {
      pvVar6 = vector<duckdb::SegmentNode<duckdb::RowGroup>,_true>::operator[]
                         ((vector<duckdb::SegmentNode<duckdb::RowGroup>,_true> *)&local_268,sVar13);
      bVar3 = ScheduleVacuumTasks(local_270,local_130,&local_160,sVar13,
                                  uVar12 < (pDVar5->options).max_vacuum_tasks);
      if (bVar3) {
        uVar12 = uVar12 + 1;
      }
      else if ((pvVar6->node).
               super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
               super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
               super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
               super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl != (RowGroup *)0x0) {
        pRVar7 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::
                 operator->(&pvVar6->node);
        pRVar11 = local_270;
        RowGroup::MoveToCollection(pRVar7,local_270,local_160.row_start);
        GetCheckpointTask((RowGroupCollection *)local_1e0,(CollectionCheckpointState *)pRVar11,
                          (idx_t)local_130);
        pTVar8 = unique_ptr<duckdb::TaskExecutor,_std::default_delete<duckdb::TaskExecutor>,_true>::
                 operator->(&local_130[0].executor);
        local_278._M_head_impl = (Task *)local_1e0._0_8_;
        local_1e0._0_8_ = (BlockManager *)0x0;
        TaskExecutor::ScheduleTask
                  (pTVar8,(unique_ptr<duckdb::Task,_std::default_delete<duckdb::Task>,_true> *)
                          &local_278);
        if ((BlockManager *)local_278._M_head_impl != (BlockManager *)0x0) {
          (*(local_278._M_head_impl)->_vptr_Task[1])();
        }
        local_278._M_head_impl = (Task *)0x0;
        pRVar7 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::
                 operator->(&pvVar6->node);
        local_160.row_start =
             local_160.row_start +
             (pRVar7->super_SegmentBase<duckdb::RowGroup>).count.super___atomic_base<unsigned_long>.
             _M_i;
        if ((BlockManager *)local_1e0._0_8_ != (BlockManager *)0x0) {
          (**(code **)(*(long *)local_1e0._0_8_ + 8))();
        }
      }
      sVar13 = sVar13 + 1;
    } while (sVar13 < (ulong)((long)local_268.
                                    super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_268.
                                    super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  pTVar8 = unique_ptr<duckdb::TaskExecutor,_std::default_delete<duckdb::TaskExecutor>,_true>::
           operator->(&local_130[0].executor);
  TaskExecutor::WorkOnTasks(pTVar8);
  if (local_268.
      super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_268.
      super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_248 = 0;
  }
  else {
    sVar13 = 0;
    local_248 = 0;
    do {
      pvVar6 = vector<duckdb::SegmentNode<duckdb::RowGroup>,_true>::operator[]
                         ((vector<duckdb::SegmentNode<duckdb::RowGroup>,_true> *)&local_268,sVar13);
      if ((pvVar6->node).super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>.
          _M_t.super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
          super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl != (RowGroup *)0x0) {
        this_03 = &pvVar6->node;
        this_01 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::
                  operator*(this_03);
        pvVar9 = vector<duckdb::unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>,_true>
                 ::operator[](&local_130[0].writers,sVar13);
        local_290._M_head_impl =
             (pvVar9->
             super_unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>_>)
             ._M_t.
             super___uniq_ptr_impl<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::RowGroupWriter_*,_std::default_delete<duckdb::RowGroupWriter>_>
             .super__Head_base<0UL,_duckdb::RowGroupWriter_*,_false>._M_head_impl;
        (pvVar9->
        super_unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>_>)._M_t
        .super___uniq_ptr_impl<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::RowGroupWriter_*,_std::default_delete<duckdb::RowGroupWriter>_>
        .super__Head_base<0UL,_duckdb::RowGroupWriter_*,_false>._M_head_impl = (RowGroupWriter *)0x0
        ;
        if (local_290._M_head_impl == (RowGroupWriter *)0x0) {
          this_02 = (InternalException *)__cxa_allocate_exception(0x10);
          local_1e0._0_8_ = local_1d0;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1e0,"Missing row group writer for index %llu","");
          InternalException::InternalException<unsigned_long>(this_02,(string *)local_1e0,sVar13);
          __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pvVar10 = vector<duckdb::RowGroupWriteData,_true>::operator[]
                            (&local_130[0].write_data,sVar13);
        local_218.states.
        super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pvVar10->states).
             super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_218.states.
        super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pvVar10->states).
             super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_218.states.
        super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pvVar10->states).
             super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pvVar10->states).
        super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pvVar10->states).
        super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar10->states).
        super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_218.statistics.
        super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
        super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pvVar10->statistics).
             super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
             super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
             _M_impl.super__Vector_impl_data._M_start;
        local_218.statistics.
        super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
        super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pvVar10->statistics).
             super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
             super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_218.statistics.
        super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
        super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pvVar10->statistics).
             super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
             super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        (pvVar10->statistics).
        super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
        super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pvVar10->statistics).
        super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
        super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar10->statistics).
        super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
        super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        writer_00 = unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>
                    ::operator*((unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>
                                 *)&local_290);
        RowGroup::Checkpoint((RowGroupPointer *)local_1e0,this_01,&local_218,writer_00,local_238);
        ::std::vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>::~vector
                  (&local_218.statistics.
                    super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
                   *)&local_218);
        local_280._M_head_impl = local_290._M_head_impl;
        local_290._M_head_impl = (RowGroupWriter *)0x0;
        (*local_240->_vptr_TableDataWriter[4])(local_240,(RowGroupPointer *)local_1e0,&local_280);
        if (local_280._M_head_impl != (RowGroupWriter *)0x0) {
          (*(local_280._M_head_impl)->_vptr_RowGroupWriter[1])();
        }
        local_280._M_head_impl = (RowGroupWriter *)0x0;
        pRVar4 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(local_220);
        local_288._M_head_impl =
             (this_03->super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>).
             _M_t.super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>.
             _M_t.super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>
             .super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl;
        (this_03->super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)._M_t.
        super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
        super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl = (RowGroup *)0x0;
        SegmentTree<duckdb::RowGroup,_true>::AppendSegment
                  (&pRVar4->super_SegmentTree<duckdb::RowGroup,_true>,(SegmentLock *)&local_230,
                   (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
                   &local_288);
        _Var2._M_head_impl = local_288._M_head_impl;
        if (local_288._M_head_impl != (RowGroup *)0x0) {
          RowGroup::~RowGroup(local_288._M_head_impl);
          operator_delete(_Var2._M_head_impl);
        }
        local_288._M_head_impl = (RowGroup *)0x0;
        _Var1 = (this_01->super_SegmentBase<duckdb::RowGroup>).count.
                super___atomic_base<unsigned_long>._M_i;
        if ((pointer)local_1d0._24_8_ != (pointer)0x0) {
          operator_delete((void *)local_1d0._24_8_);
        }
        if ((void *)local_1d0._0_8_ != (void *)0x0) {
          operator_delete((void *)local_1d0._0_8_);
        }
        if (local_290._M_head_impl != (RowGroupWriter *)0x0) {
          (*(local_290._M_head_impl)->_vptr_RowGroupWriter[1])();
        }
        local_248 = local_248 + _Var1;
      }
      sVar13 = sVar13 + 1;
    } while (sVar13 < (ulong)((long)local_268.
                                    super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_268.
                                    super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  LOCK();
  (local_270->total_rows).super___atomic_base<unsigned_long>._M_i = local_248;
  UNLOCK();
  if (local_160.row_group_counts.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_160.row_group_counts.
                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ::std::vector<duckdb::RowGroupWriteData,_std::allocator<duckdb::RowGroupWriteData>_>::~vector
            (&local_130[0].write_data.
              super_vector<duckdb::RowGroupWriteData,_std::allocator<duckdb::RowGroupWriteData>_>);
  ::std::
  vector<duckdb::unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>_>_>
  ::~vector(&local_130[0].writers.
             super_vector<duckdb::unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>_>_>
           );
  if (local_130[0].executor.
      super_unique_ptr<duckdb::TaskExecutor,_std::default_delete<duckdb::TaskExecutor>_>._M_t.
      super___uniq_ptr_impl<duckdb::TaskExecutor,_std::default_delete<duckdb::TaskExecutor>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::TaskExecutor_*,_std::default_delete<duckdb::TaskExecutor>_>.
      super__Head_base<0UL,_duckdb::TaskExecutor_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::TaskExecutor,_std::default_delete<duckdb::TaskExecutor>,_true,_true>)
      0x0) {
    TaskExecutor::~TaskExecutor
              ((TaskExecutor *)
               local_130[0].executor.
               super_unique_ptr<duckdb::TaskExecutor,_std::default_delete<duckdb::TaskExecutor>_>.
               _M_t.
               super___uniq_ptr_impl<duckdb::TaskExecutor,_std::default_delete<duckdb::TaskExecutor>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::TaskExecutor_*,_std::default_delete<duckdb::TaskExecutor>_>
               .super__Head_base<0UL,_duckdb::TaskExecutor_*,_false>._M_head_impl);
    operator_delete((void *)local_130[0].executor.
                            super_unique_ptr<duckdb::TaskExecutor,_std::default_delete<duckdb::TaskExecutor>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::TaskExecutor,_std::default_delete<duckdb::TaskExecutor>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::TaskExecutor_*,_std::default_delete<duckdb::TaskExecutor>_>
                            .super__Head_base<0UL,_duckdb::TaskExecutor_*,_false>._M_head_impl);
  }
  ::std::
  vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
  ::~vector(&local_268);
  ::std::unique_lock<std::mutex>::~unique_lock(&local_230);
  return;
}

Assistant:

void RowGroupCollection::Checkpoint(TableDataWriter &writer, TableStatistics &global_stats) {
	auto l = row_groups->Lock();
	auto segments = row_groups->MoveSegments(l);

	CollectionCheckpointState checkpoint_state(*this, writer, segments, global_stats);

	VacuumState vacuum_state;
	InitializeVacuumState(checkpoint_state, vacuum_state, segments);

	try {
		// schedule tasks
		idx_t total_vacuum_tasks = 0;
		auto &config = DBConfig::GetConfig(writer.GetDatabase());

		for (idx_t segment_idx = 0; segment_idx < segments.size(); segment_idx++) {
			auto &entry = segments[segment_idx];
			auto vacuum_tasks = ScheduleVacuumTasks(checkpoint_state, vacuum_state, segment_idx,
			                                        total_vacuum_tasks < config.options.max_vacuum_tasks);
			if (vacuum_tasks) {
				// vacuum tasks were scheduled - don't schedule a checkpoint task yet
				total_vacuum_tasks++;
				continue;
			}
			if (!entry.node) {
				// row group was vacuumed/dropped - skip
				continue;
			}
			// schedule a checkpoint task for this row group
			entry.node->MoveToCollection(*this, vacuum_state.row_start);
			auto checkpoint_task = GetCheckpointTask(checkpoint_state, segment_idx);
			checkpoint_state.executor->ScheduleTask(std::move(checkpoint_task));
			vacuum_state.row_start += entry.node->count;
		}
	} catch (const std::exception &e) {
		ErrorData error(e);
		checkpoint_state.executor->PushError(std::move(error));
		checkpoint_state.executor->WorkOnTasks(); // ensure all tasks have completed first before rethrowing
		throw;
	}
	// all tasks have been successfully scheduled - execute tasks until we are done
	checkpoint_state.executor->WorkOnTasks();

	// no errors - finalize the row groups
	idx_t new_total_rows = 0;
	for (idx_t segment_idx = 0; segment_idx < segments.size(); segment_idx++) {
		auto &entry = segments[segment_idx];
		if (!entry.node) {
			// row group was vacuumed/dropped - skip
			continue;
		}
		auto &row_group = *entry.node;
		auto row_group_writer = std::move(checkpoint_state.writers[segment_idx]);
		if (!row_group_writer) {
			throw InternalException("Missing row group writer for index %llu", segment_idx);
		}
		auto pointer =
		    row_group.Checkpoint(std::move(checkpoint_state.write_data[segment_idx]), *row_group_writer, global_stats);
		writer.AddRowGroup(std::move(pointer), std::move(row_group_writer));
		row_groups->AppendSegment(l, std::move(entry.node));
		new_total_rows += row_group.count;
	}
	total_rows = new_total_rows;
}